

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O0

int __thiscall prometheus::Gateway::Delete(Gateway *this)

{
  int iVar1;
  pointer this_00;
  string local_30 [32];
  Gateway *local_10;
  Gateway *this_local;
  
  local_10 = this;
  this_00 = ::std::
            unique_ptr<prometheus::detail::CurlWrapper,_std::default_delete<prometheus::detail::CurlWrapper>_>
            ::operator->(&this->curlWrapper_);
  ::std::__cxx11::string::string(local_30);
  iVar1 = detail::CurlWrapper::performHttpRequest(this_00,Delete,&this->jobUri_,(string *)local_30);
  ::std::__cxx11::string::~string(local_30);
  return iVar1;
}

Assistant:

int Gateway::Delete() {
  return curlWrapper_->performHttpRequest(detail::HttpMethod::Delete, jobUri_);
}